

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_rerolled_array_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *parent_type,string *base_expr
          ,SPIRType *type)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  char (*in_R9) [2];
  uint __val;
  bool bVar4;
  spirv_cross local_1f0 [32];
  string local_1d0;
  string subexpr;
  undefined1 local_190 [208];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint local_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  if (type->basetype == Boolean && parent_type->basetype == Struct) {
    bVar4 = (this->backend).boolean_in_struct_remapped_type != Boolean;
  }
  else {
    bVar4 = false;
  }
  local_190._32_8_ = local_190 + 0x38;
  local_190._0_8_ = &PTR__SPIRType_0047ef28;
  local_190._8_8_ = 0;
  local_190._16_4_ = Unknown;
  local_190._20_4_ = 0;
  local_190._24_4_ = 1;
  local_190._28_4_ = 1;
  local_190._40_8_ = 0;
  local_190._48_8_ = 8;
  local_190._88_8_ = local_190 + 0x70;
  local_190._96_8_ = 0;
  local_190._104_8_ = 8;
  local_190._120_4_ = 0;
  local_190[0x7c] = false;
  local_190[0x7d] = false;
  local_190._128_4_ = 0;
  local_190._132_4_ = 0;
  local_190._136_4_ = 0;
  local_190._140_4_ = 0;
  local_190._144_4_ = Generic;
  local_190._152_8_ = local_190 + 0xb0;
  local_190._160_8_ = 0;
  local_190._168_8_ = 8;
  local_c0 = local_a8;
  local_b8 = 0;
  local_b0 = 8;
  local_68 = &p_Stack_38;
  local_88._0_7_ = 0;
  local_88._7_4_ = 0;
  local_6c.id = 0;
  local_88._12_4_ = 0;
  local_88._16_4_ = ImageFormatUnknown;
  local_88._20_4_ = AccessQualifierReadOnly;
  local_88._24_4_ = 0;
  local_60 = 1;
  local_58._M_nxt = (_Hash_node_base *)0x0;
  sStack_50 = 0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  if (bVar4) {
    local_190._28_4_ = local_190._24_4_;
    pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(type->parent_type).id);
    SPIRType::operator=((SPIRType *)local_190,pSVar3);
    local_190._16_4_ = (this->backend).boolean_in_struct_remapped_type;
    bVar4 = true;
    uVar2 = local_190._28_4_;
  }
  else {
    bVar4 = false;
    uVar2 = local_190._24_4_;
    if ((type->basetype == Boolean) &&
       (uVar2 = local_190._28_4_, (this->backend).boolean_in_struct_remapped_type != Boolean)) {
      local_190._28_4_ = local_190._24_4_;
      pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(type->parent_type).id);
      bVar4 = true;
      SPIRType::operator=((SPIRType *)local_190,pSVar3);
      uVar2 = local_190._28_4_;
    }
  }
  local_190._28_4_ = uVar2;
  uVar2 = to_array_size_literal(this,type);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(type->parent_type).id);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,"{ ",(allocator *)&subexpr);
  __val = 0;
  while (uVar2 != __val) {
    ::std::__cxx11::to_string(&local_1d0,__val);
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (&subexpr,(spirv_cross *)base_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x330702,
               (char (*) [2])&local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x330607,in_R9);
    ::std::__cxx11::string::~string((string *)&local_1d0);
    bVar1 = Compiler::is_array(&this->super_Compiler,pSVar3);
    if (bVar1) {
      to_rerolled_array_expression(&local_1d0,this,parent_type,&subexpr,pSVar3);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_1d0);
    }
    else {
      if (bVar4) {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1f0,this,local_190,0);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_1d0,local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3457d9,
                   (char (*) [2])&subexpr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3511f2,
                   in_R9);
        ::std::__cxx11::string::operator=((string *)&subexpr,(string *)&local_1d0);
        ::std::__cxx11::string::~string((string *)&local_1d0);
        ::std::__cxx11::string::~string((string *)local_1f0);
      }
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    __val = __val + 1;
    if (__val < uVar2) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::~string((string *)&subexpr);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  SPIRType::~SPIRType((SPIRType *)local_190);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_rerolled_array_expression(const SPIRType &parent_type,
                                                  const string &base_expr, const SPIRType &type)
{
	bool remapped_boolean = parent_type.basetype == SPIRType::Struct &&
	                        type.basetype == SPIRType::Boolean &&
	                        backend.boolean_in_struct_remapped_type != SPIRType::Boolean;

	SPIRType tmp_type { OpNop };
	if (remapped_boolean)
	{
		tmp_type = get<SPIRType>(type.parent_type);
		tmp_type.basetype = backend.boolean_in_struct_remapped_type;
	}
	else if (type.basetype == SPIRType::Boolean && backend.boolean_in_struct_remapped_type != SPIRType::Boolean)
	{
		// It's possible that we have an r-value expression that was OpLoaded from a struct.
		// We have to reroll this and explicitly cast the input to bool, because the r-value is short.
		tmp_type = get<SPIRType>(type.parent_type);
		remapped_boolean = true;
	}

	uint32_t size = to_array_size_literal(type);
	auto &parent = get<SPIRType>(type.parent_type);
	string expr = "{ ";

	for (uint32_t i = 0; i < size; i++)
	{
		auto subexpr = join(base_expr, "[", convert_to_string(i), "]");
		if (!is_array(parent))
		{
			if (remapped_boolean)
				subexpr = join(type_to_glsl(tmp_type), "(", subexpr, ")");
			expr += subexpr;
		}
		else
			expr += to_rerolled_array_expression(parent_type, subexpr, parent);

		if (i + 1 < size)
			expr += ", ";
	}

	expr += " }";
	return expr;
}